

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_expression.cpp
# Opt level: O3

void __thiscall duckdb::BoundExpression::Serialize(BoundExpression *this,Serializer *serializer)

{
  SerializationException *this_00;
  string local_40;
  
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot serialize bound expression","");
  SerializationException::SerializationException(this_00,&local_40);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BoundExpression::Serialize(Serializer &serializer) const {
	throw SerializationException("Cannot serialize bound expression");
}